

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O1

void __thiscall
TcpClient::TcpClient(TcpClient *this,string *ip_address,uint port_number,io_service *ios)

{
  this->m_ios = ios;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            ((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&this->m_active_socket,ios,(type *)0x0);
  boost::asio::ip::make_address(&this->m_remote_ip,(ip_address->_M_dataplus)._M_p);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&this->m_remote_endpoint,&this->m_remote_ip,(unsigned_short)this->m_remote_port);
  this->m_remote_port = port_number;
  (this->m_socket_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_socket_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_socket_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_socket_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_socket_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  connectToServer(this);
  return;
}

Assistant:

TcpClient::TcpClient(std::string const & ip_address, unsigned int port_number, boost::asio::io_service & ios):
	m_ios(ios),
	m_remote_ip(boost::asio::ip::address::from_string(ip_address)),
	m_remote_port(port_number),
	m_remote_endpoint(m_remote_ip, m_remote_port),
	m_active_socket(m_ios)
{
	connectToServer();
}